

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O0

void __thiscall gmath::IDWNode::IDWNode(IDWNode *this,uint _x,uint _y,uint _s,IDWNode *_child)

{
  undefined8 uVar1;
  uint in_ECX;
  uint in_EDX;
  ulong uVar2;
  ulong in_RSI;
  uint *in_RDI;
  uint *in_R8;
  int i;
  int local_80;
  allocator local_79;
  string local_78 [16];
  string *in_stack_ffffffffffffff98;
  InvalidArgumentException *in_stack_ffffffffffffffa0;
  allocator local_41;
  string local_40 [52];
  uint local_c;
  
  local_c = (uint)in_RSI;
  uVar2 = (in_RSI & 0xffffffff) % (ulong)in_ECX;
  if (((local_c / in_ECX) * in_ECX != local_c) ||
     (uVar2 = (ulong)in_EDX % (ulong)in_ECX, (in_EDX / in_ECX) * in_ECX != in_EDX)) {
    uVar1 = __cxa_allocate_exception(0x28,in_RSI,uVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"IDWNode: Illegal location",&local_41);
    gutil::InvalidArgumentException::InvalidArgumentException
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    __cxa_throw(uVar1,&gutil::InvalidArgumentException::typeinfo,
                gutil::InvalidArgumentException::~InvalidArgumentException);
  }
  if ((((local_c <= *in_R8) && (*in_R8 < local_c + in_ECX)) && (in_EDX <= in_R8[1])) &&
     (in_R8[1] < in_EDX + in_ECX)) {
    *in_RDI = local_c;
    in_RDI[1] = in_EDX;
    in_RDI[2] = in_ECX;
    in_RDI[3] = (uint)(float)(in_RDI[2] * in_RDI[2] * 0x19);
    in_RDI[4] = (uint)(((float)in_RDI[2] * 0.5 + (float)*in_RDI) - 0.5);
    in_RDI[5] = (uint)(((float)in_RDI[2] * 0.5 + (float)in_RDI[1]) - 0.5);
    in_RDI[10] = 0;
    in_RDI[0xb] = 0;
    in_RDI[0xc] = 0;
    in_RDI[0xd] = 0;
    in_RDI[0xe] = 0;
    in_RDI[0xf] = 0;
    in_RDI[0x10] = 0;
    in_RDI[0x11] = 0;
    if (*in_R8 < *in_RDI + (in_RDI[2] >> 1)) {
      local_80 = 2;
      if (in_R8[1] < in_RDI[1] + (in_RDI[2] >> 1)) {
        local_80 = 0;
      }
    }
    else {
      local_80 = 3;
      if (in_R8[1] < in_RDI[1] + (in_RDI[2] >> 1)) {
        local_80 = 1;
      }
    }
    *(uint **)(in_RDI + (long)local_80 * 2 + 10) = in_R8;
    in_RDI[6] = in_R8[6];
    in_RDI[7] = in_R8[7];
    in_RDI[8] = in_R8[8];
    return;
  }
  uVar1 = __cxa_allocate_exception(0x28,in_RSI,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"IDWNode: Child is not covered by parent",&local_79);
  gutil::InvalidArgumentException::InvalidArgumentException
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __cxa_throw(uVar1,&gutil::InvalidArgumentException::typeinfo,
              gutil::InvalidArgumentException::~InvalidArgumentException);
}

Assistant:

IDWNode::IDWNode(unsigned int _x, unsigned int _y, unsigned int _s, IDWNode *_child)
{
  // sanity checks

  if (_x/_s*_s != _x || _y/_s*_s != _y)
  {
    throw gutil::InvalidArgumentException(std::string("IDWNode: Illegal location"));
  }

  if (_child->x < _x || _child->x >= _x+_s || _child->y < _y || _child->y >= _y+_s)
  {
    throw gutil::InvalidArgumentException(std::string("IDWNode: Child is not covered by parent"));
  }

  x=_x;
  y=_y;
  s=_s;

  r2=static_cast<float>(25*s*s);
  xs=x+0.5f*s-0.5f;
  ys=y+0.5f*s-0.5f;

  // add child

  child[0]=0;
  child[1]=0;
  child[2]=0;
  child[3]=0;

  int i;
  if (_child->x < x+(s>>1))
  {
    i=2;
    if (_child->y < y+(s>>1))
    {
      i=0;
    }
  }
  else
  {
    i=3;
    if (_child->y < y+(s>>1))
    {
      i=1;
    }
  }

  child[i]=_child;

  // take data from child as data of this node

  n=_child->n;
  f=_child->f;
  w=_child->w;
}